

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionPrivate::startHostInfoLookup(QHttpNetworkConnectionPrivate *this)

{
  bool bVar1;
  Int IVar2;
  ConnectionType c;
  QHttpNetworkConnectionPrivate *in_RDI;
  long in_FS_OFFSET;
  NetworkLayerProtocol protocol;
  QHostInfo hostInfo;
  bool immediateResultValid;
  int hostLookupId;
  QHostAddress temp;
  QString lookupHost;
  undefined4 in_stack_ffffffffffffff68;
  Capability in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QHttpNetworkConnectionPrivate *member;
  QObject *in_stack_ffffffffffffff88;
  int *id;
  uint in_stack_ffffffffffffff90;
  undefined4 uVar3;
  char *member_00;
  QObject *in_stack_ffffffffffffffa0;
  QString *in_stack_ffffffffffffffa8;
  QHostInfo *in_stack_ffffffffffffffb0;
  QFlagsStorage<QNetworkProxy::Capability> in_stack_ffffffffffffffb8;
  QFlagsStorage<QNetworkProxy::Capability> in_stack_ffffffffffffffbc;
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_24;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->networkLayerState = HostLookupPending;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  member = in_RDI;
  QString::QString((QString *)in_RDI,
                   (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QNetworkProxy::capabilities((QNetworkProxy *)in_RDI);
  local_24.super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (QFlagsStorage<QNetworkProxy::Capability>)
       QFlags<QNetworkProxy::Capability>::operator&
                 ((QFlags<QNetworkProxy::Capability> *)in_RDI,in_stack_ffffffffffffff6c);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
  if (IVar2 == 0) {
    in_stack_ffffffffffffffb8.i = (Int)QNetworkProxy::capabilities((QNetworkProxy *)in_RDI);
    in_stack_ffffffffffffffbc.i =
         (Int)QFlags<QNetworkProxy::Capability>::operator&
                        ((QFlags<QNetworkProxy::Capability> *)in_RDI,in_stack_ffffffffffffff6c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffbc);
    if (IVar2 != 0) {
      QNetworkProxy::hostName
                ((QNetworkProxy *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QString::operator=((QString *)in_RDI,
                         (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      QString::~QString((QString *)0x2ed949);
    }
  }
  else {
    QNetworkProxy::hostName
              ((QNetworkProxy *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QString::operator=((QString *)in_RDI,
                       (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QString::~QString((QString *)0x2ed8d3);
  }
  member_00 = (char *)0xaaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress((QHostAddress *)in_RDI);
  bVar1 = QHostAddress::setAddress
                    ((QHostAddress *)in_RDI,
                     (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (bVar1) {
    c = QHostAddress::protocol((QHostAddress *)0x2ed983);
    if (c == AutoConnection) {
      in_RDI->networkLayerState = IPv4;
      q_func(in_RDI);
      QMetaObject::invokeMethod<>(in_stack_ffffffffffffff88,(char *)member,c);
    }
    else if (c == DirectConnection) {
      in_RDI->networkLayerState = IPv6;
      q_func(in_RDI);
      QMetaObject::invokeMethod<>(in_stack_ffffffffffffff88,(char *)member,c);
    }
  }
  else {
    uVar3 = 0xaaaaaaaa;
    in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 & 0xffffff;
    id = (int *)0xaaaaaaaaaaaaaaaa;
    q_func(in_RDI);
    qt_qhostinfo_lookup(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,member_00,
                        (bool *)CONCAT44(uVar3,in_stack_ffffffffffffff90),id);
    if ((in_stack_ffffffffffffff90 & 0x1000000) != 0) {
      _q_hostLookupFinished
                ((QHttpNetworkConnectionPrivate *)
                 CONCAT44(in_stack_ffffffffffffffbc.i,in_stack_ffffffffffffffb8.i),
                 in_stack_ffffffffffffffb0);
    }
    QHostInfo::~QHostInfo((QHostInfo *)in_RDI);
  }
  QHostAddress::~QHostAddress((QHostAddress *)0x2eda72);
  QString::~QString((QString *)0x2eda7c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionPrivate::startHostInfoLookup()
{
    networkLayerState = HostLookupPending;

    // check if we already now can decide if this is IPv4 or IPv6
    QString lookupHost = hostName;
#ifndef QT_NO_NETWORKPROXY
    if (networkProxy.capabilities() & QNetworkProxy::HostNameLookupCapability) {
        lookupHost = networkProxy.hostName();
    } else if (channels[0].proxy.capabilities() & QNetworkProxy::HostNameLookupCapability) {
        lookupHost = channels[0].proxy.hostName();
    }
#endif
    QHostAddress temp;
    if (temp.setAddress(lookupHost)) {
        const QAbstractSocket::NetworkLayerProtocol protocol = temp.protocol();
        if (protocol == QAbstractSocket::IPv4Protocol) {
            networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
            QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
            return;
        } else if (protocol == QAbstractSocket::IPv6Protocol) {
            networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
            QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }
    } else {
        int hostLookupId;
        bool immediateResultValid = false;
        QHostInfo hostInfo = qt_qhostinfo_lookup(lookupHost,
                                                 this->q_func(),
                                                 SLOT(_q_hostLookupFinished(QHostInfo)),
                                                 &immediateResultValid,
                                                 &hostLookupId);
        if (immediateResultValid) {
            _q_hostLookupFinished(hostInfo);
        }
    }
}